

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkObj.c
# Opt level: O1

Nwk_Obj_t * Nwk_ManCreateObj(Nwk_Man_t *p,int nFanins,int nFanouts)

{
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  Nwk_Obj_t *pNVar4;
  void **ppvVar5;
  int iVar6;
  
  pNVar4 = (Nwk_Obj_t *)
           Aig_MmFlexEntryFetch(p->pMemObjs,(p->nFanioPlus + nFanins + nFanouts) * 8 + 0x50);
  pNVar4->nFanouts = 0;
  pNVar4->nFanioAlloc = 0;
  pNVar4->pFanio = (Nwk_Obj_t **)0x0;
  pNVar4->pMan = (Nwk_Man_t *)0x0;
  pNVar4->pFunc = (Hop_Obj_t *)0x0;
  pNVar4->pCopy = (void *)0x0;
  (pNVar4->field_3).pNext = (void *)0x0;
  *(undefined8 *)&pNVar4->field_0x20 = 0;
  pNVar4->TravId = 0;
  pNVar4->Level = 0;
  pNVar4->tArrival = 0.0;
  pNVar4->tRequired = 0.0;
  pNVar4->tSlack = 0.0;
  pNVar4->nFanins = 0;
  pNVar4->pFanio = (Nwk_Obj_t **)(pNVar4 + 1);
  pVVar3 = p->vObjs;
  uVar1 = pVVar3->nSize;
  pNVar4->Id = uVar1;
  uVar2 = pVVar3->nCap;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar3->pArray,0x80);
      }
      pVVar3->pArray = ppvVar5;
      iVar6 = 0x10;
    }
    else {
      iVar6 = uVar2 * 2;
      if (iVar6 <= (int)uVar2) goto LAB_008df218;
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar3->pArray,(ulong)uVar2 << 4);
      }
      pVVar3->pArray = ppvVar5;
    }
    pVVar3->nCap = iVar6;
  }
LAB_008df218:
  iVar6 = pVVar3->nSize;
  pVVar3->nSize = iVar6 + 1;
  pVVar3->pArray[iVar6] = pNVar4;
  pNVar4->pMan = p;
  pNVar4->nFanioAlloc = nFanins + nFanouts + p->nFanioPlus;
  return pNVar4;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates an object.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Nwk_Obj_t * Nwk_ManCreateObj( Nwk_Man_t * p, int nFanins, int nFanouts )
{
    Nwk_Obj_t * pObj;
    pObj = (Nwk_Obj_t *)Aig_MmFlexEntryFetch( p->pMemObjs, sizeof(Nwk_Obj_t) + (nFanins + nFanouts + p->nFanioPlus) * sizeof(Nwk_Obj_t *) );
    memset( pObj, 0, sizeof(Nwk_Obj_t) );
    pObj->pFanio = (Nwk_Obj_t **)((char *)pObj + sizeof(Nwk_Obj_t));
    pObj->Id = Vec_PtrSize( p->vObjs );
    Vec_PtrPush( p->vObjs, pObj );
    pObj->pMan        = p;
    pObj->nFanioAlloc = nFanins + nFanouts + p->nFanioPlus;
    return pObj;
}